

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O1

bool __thiscall GlobOpt::DoObjTypeSpec(GlobOpt *this,Loop *loop)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  JITTimeFunctionBody *pJVar5;
  FunctionJITTimeInfo *pFVar6;
  JITTimeProfileInfo *this_00;
  undefined4 *puVar7;
  
  bVar2 = Func::DoFastPaths(this->func);
  if (bVar2) {
    pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar3 = JITTimeFunctionBody::GetSourceContextId(pJVar5);
    pFVar6 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar4 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar6);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b0240,ObjTypeSpecPhase,uVar3,uVar4);
    if (bVar2) {
      return true;
    }
    pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar3 = JITTimeFunctionBody::GetSourceContextId(pJVar5);
    pFVar6 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar4 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar6);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,ObjTypeSpecPhase,uVar3,uVar4);
    if (!bVar2) {
      bVar2 = JITTimeWorkItem::IsLoopBody(this->func->m_workItem);
      if (bVar2) {
        pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        bVar2 = JITTimeFunctionBody::HasProfileInfo(pJVar5);
        if (bVar2) {
          pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
          this_00 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar5);
          bVar2 = JITTimeProfileInfo::IsObjTypeSpecDisabledInJitLoopBody(this_00);
          if (bVar2) {
            return false;
          }
        }
      }
      bVar2 = ImplicitCallFlagsAllowOpts(this->func);
      if (bVar2) {
        if (loop == (Loop *)0x0) {
          return true;
        }
        bVar2 = Loop::CanDoFieldCopyProp(loop);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                             ,0x52,"(loop == nullptr || loop->CanDoFieldCopyProp())",
                             "loop == nullptr || loop->CanDoFieldCopyProp()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar7 = 0;
          return true;
        }
        return true;
      }
      if (loop != (Loop *)0x0) {
        bVar2 = Loop::CanDoFieldCopyProp(loop);
        return bVar2;
      }
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::DoObjTypeSpec(Loop *loop) const
{
    if (!this->func->DoFastPaths())
    {
        return false;
    }
    if (PHASE_FORCE(Js::ObjTypeSpecPhase, this->func))
    {
        return true;
    }
    if (PHASE_OFF(Js::ObjTypeSpecPhase, this->func))
    {
        return false;
    }
    if (this->func->IsLoopBody() && this->func->HasProfileInfo() && this->func->GetReadOnlyProfileInfo()->IsObjTypeSpecDisabledInJitLoopBody())
    {
        return false;
    }
    if (this->ImplicitCallFlagsAllowOpts(this->func))
    {
        Assert(loop == nullptr || loop->CanDoFieldCopyProp());
        return true;
    }
    return loop != nullptr && loop->CanDoFieldCopyProp();
}